

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_file_system.cxx
# Opt level: O0

bool __thiscall xray_re::xr_file_system::folder_exist(xr_file_system *this,char *path,char *name)

{
  bool local_71;
  bool local_51;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  path_alias *local_30;
  path_alias *pa;
  char *name_local;
  char *path_local;
  xr_file_system *this_local;
  
  pa = (path_alias *)name;
  name_local = path;
  path_local = (char *)this;
  local_30 = find_path_alias(this,path);
  local_51 = local_30 == (path_alias *)0x0;
  if (local_51) {
    local_71 = false;
  }
  else {
    std::operator+(&local_50,&local_30->root,(char *)pa);
    local_71 = folder_exist(&local_50);
  }
  local_51 = !local_51;
  this_local._7_1_ = local_71;
  if (local_51) {
    std::__cxx11::string::~string((string *)&local_50);
  }
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool xr_file_system::folder_exist(const char* path, const char* name) const
{
	const path_alias* pa = find_path_alias(path);
	return pa ? folder_exist(pa->root + name) : false;
}